

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.cpp
# Opt level: O1

tuple<const_char_*,_long> __thiscall ReadBuffer::get_chars(ReadBuffer *this,ssize_t n)

{
  long lVar1;
  long lVar2;
  _Head_base<0UL,_const_char_*,_false> in_RDX;
  char *pcVar3;
  tuple<const_char_*,_long> tVar4;
  tuple<const_char_*,_long> tVar5;
  
  lVar1 = *(long *)(n + 0x10);
  pcVar3 = (char *)(*(long *)(n + 0x18) - lVar1);
  if (pcVar3 == (char *)0x0) {
    this->buffer = (char *)0x0;
    this->buffer_size = 0;
    tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
    _M_head_impl = in_RDX._M_head_impl;
    tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
    super__Head_base<1UL,_long,_false>._M_head_impl =
         (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)this;
    return (tuple<const_char_*,_long>)tVar4.super__Tuple_impl<0UL,_const_char_*,_long>;
  }
  lVar2 = *(long *)n;
  if ((long)pcVar3 < (long)in_RDX._M_head_impl) {
    *(long *)(n + 0x10) = 0;
    *(undefined8 *)(n + 0x18) = 0;
    this->buffer = pcVar3;
  }
  else {
    *(long *)(n + 0x10) = (long)(in_RDX._M_head_impl + lVar1);
    this->buffer = in_RDX._M_head_impl;
  }
  this->buffer_size = lVar2 + lVar1;
  tVar5.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
  _M_head_impl = in_RDX._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)this;
  return (tuple<const_char_*,_long>)tVar5.super__Tuple_impl<0UL,_const_char_*,_long>;
}

Assistant:

std::tuple<const char *, ssize_t> ReadBuffer::get_chars(ssize_t n) {
    if (this->right == this->left) {
        return std::make_tuple(nullptr, 0);
    }
    if (this->right - this->left >= n) {
        auto result = std::make_tuple(this->buffer + this->left, n);
        this->left += n;
        return result;
    } else {
        auto result = std::make_tuple(this->buffer + this->left, this->right - this->left);
        this->left = 0;
        this->right = 0;
        return result;
    }
}